

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_pkcs1_verify
              (mbedtls_rsa_context *ctx,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig
              )

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  uchar *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (((in_ESI == 0) && (in_EDX == 0)) || (in_RCX != 0)) {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      iVar1 = mbedtls_rsa_rsassa_pkcs1_v15_verify
                        ((mbedtls_rsa_context *)hash,sig._4_4_,(uint)sig,
                         (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI);
    }
    else {
      iVar1 = -0x4100;
    }
  }
  else {
    iVar1 = -0x4080;
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_pkcs1_verify(mbedtls_rsa_context *ctx,
                             mbedtls_md_type_t md_alg,
                             unsigned int hashlen,
                             const unsigned char *hash,
                             const unsigned char *sig)
{
    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    switch (ctx->padding) {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_verify(ctx, md_alg,
                                                       hashlen, hash, sig);
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_verify(ctx, md_alg,
                                                 hashlen, hash, sig);
#endif

        default:
            return MBEDTLS_ERR_RSA_INVALID_PADDING;
    }
}